

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

SoftmaxNDLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_softmaxnd(NeuralNetworkLayer *this)

{
  ulong uVar1;
  LayerUnion LVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] == 0x3b6) {
    LVar2 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x3b6;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    LVar2.softmaxnd_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::SoftmaxNDLayerParams>
                   (arena);
    (this->layer_).softmaxnd_ = (SoftmaxNDLayerParams *)LVar2;
  }
  return (SoftmaxNDLayerParams *)LVar2.convolution_;
}

Assistant:

inline ::CoreML::Specification::SoftmaxNDLayerParams* NeuralNetworkLayer::_internal_mutable_softmaxnd() {
  if (!_internal_has_softmaxnd()) {
    clear_layer();
    set_has_softmaxnd();
    layer_.softmaxnd_ = CreateMaybeMessage< ::CoreML::Specification::SoftmaxNDLayerParams >(GetArenaForAllocation());
  }
  return layer_.softmaxnd_;
}